

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O2

void __thiscall ASDCP::JP2K::MXFSReader::~MXFSReader(MXFSReader *this)

{
  ~MXFSReader(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

ASDCP::JP2K::MXFSReader::~MXFSReader()
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    m_Reader->Close();
}